

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.c
# Opt level: O1

void remove_all_pending_deliveries(LINK_INSTANCE *link,_Bool indicate_settled)

{
  LIST_ITEM_HANDLE item_handle;
  LIST_ITEM_HANDLE pLVar1;
  ASYNC_OPERATION_HANDLE async_operation;
  
  if (link->pending_deliveries != (SINGLYLINKEDLIST_HANDLE)0x0) {
    item_handle = singlylinkedlist_get_head_item(link->pending_deliveries);
    while (item_handle != (LIST_ITEM_HANDLE)0x0) {
      pLVar1 = singlylinkedlist_get_next_item(item_handle);
      async_operation = (ASYNC_OPERATION_HANDLE)singlylinkedlist_item_get_value(item_handle);
      item_handle = pLVar1;
      if (async_operation != (ASYNC_OPERATION_HANDLE)0x0) {
        if ((indicate_settled) &&
           (async_operation[2].async_operation_cancel_handler !=
            (ASYNC_OPERATION_CANCEL_HANDLER_FUNC)0x0)) {
          (*async_operation[2].async_operation_cancel_handler)
                    ((ASYNC_OPERATION_HANDLE)async_operation[3].async_operation_cancel_handler);
        }
        async_operation_destroy(async_operation);
      }
    }
    singlylinkedlist_destroy(link->pending_deliveries);
    link->pending_deliveries = (SINGLYLINKEDLIST_HANDLE)0x0;
  }
  return;
}

Assistant:

static void remove_all_pending_deliveries(LINK_INSTANCE* link, bool indicate_settled)
{
    if (link->pending_deliveries != NULL)
    {
        LIST_ITEM_HANDLE item = singlylinkedlist_get_head_item(link->pending_deliveries);
        while (item != NULL)
        {
            LIST_ITEM_HANDLE next_item = singlylinkedlist_get_next_item(item);
            ASYNC_OPERATION_HANDLE pending_delivery_operation = (ASYNC_OPERATION_HANDLE)singlylinkedlist_item_get_value(item);
            if (pending_delivery_operation != NULL)
            {
                DELIVERY_INSTANCE* delivery_instance = (DELIVERY_INSTANCE*)GET_ASYNC_OPERATION_CONTEXT(DELIVERY_INSTANCE, pending_delivery_operation);
                if (indicate_settled && (delivery_instance->on_delivery_settled != NULL))
                {
                    delivery_instance->on_delivery_settled(delivery_instance->callback_context, delivery_instance->delivery_id, LINK_DELIVERY_SETTLE_REASON_NOT_DELIVERED, NULL);
                }

                async_operation_destroy(pending_delivery_operation);
            }

            item = next_item;
        }

        singlylinkedlist_destroy(link->pending_deliveries);
        link->pending_deliveries = NULL;
    }
}